

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int stscanf(tchar_t *In,tchar_t *Mask,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list Arg;
  size_t local_28;
  size_t InLen;
  tchar_t *ptStack_18;
  int n;
  tchar_t *Mask_local;
  tchar_t *In_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ptStack_18 = Mask;
  Mask_local = In;
  local_28 = strlen(In);
  Arg[0].overflow_arg_area = local_f8;
  Arg[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x10;
  iVar1 = var_stscanf_s(Mask_local,&local_28,ptStack_18,(__va_list_tag *)local_48);
  return iVar1;
}

Assistant:

int stscanf(const tchar_t* In, const tchar_t* Mask, ...)
{
    int n;
    size_t InLen = tcslen(In);
	va_list Arg;
	va_start(Arg, Mask);
    n = var_stscanf_s(In,&InLen,Mask,Arg);
	va_end(Arg);
    return n;
}